

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

LY_ERR lydxml_subtree_r(lyd_xml_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ushort uVar1;
  uint uVar2;
  char *str;
  lysc_ext_instance *plVar3;
  lysc_ext *plVar4;
  lysc_node *plVar5;
  long lVar6;
  LY_ERR LVar7;
  int iVar8;
  LY_ERR LVar9;
  lyxml_ns *plVar10;
  lys_module *plVar11;
  lysc_node *plVar12;
  uint32_t *opts;
  void *pvVar13;
  lyxml_ctx *plVar14;
  ly_err_item *plVar15;
  lyd_node *plVar16;
  size_t sVar17;
  lyd_node **first_p_00;
  lyd_node *plVar18;
  long lVar19;
  ulong str_len;
  ly_ctx *ctx;
  lysc_node **pplVar20;
  char *pcVar21;
  lysc_ext_instance *plVar22;
  ly_ctx *plVar23;
  uint uVar24;
  void *pvVar25;
  uint32_t options;
  char cVar26;
  bool bVar27;
  lysc_node *plVar28;
  lyd_node *node;
  ly_ctx *local_158;
  lysc_node *snode;
  lyd_node *local_148;
  LY_ERR local_13c;
  char *local_138;
  ulong local_130;
  lyxml_ctx *local_128;
  char *local_120;
  lyxml_ctx *local_118;
  size_t local_110;
  lyd_meta *meta;
  lysc_ext_instance *ext;
  uint32_t hints;
  lysc_node *local_f0;
  lys_module *local_e8;
  lysc_node *local_e0;
  LY_VALUE_FORMAT local_d4;
  lyd_attr *attr;
  lyd_node *local_c8;
  uint local_bc;
  lyd_node *insert_anchor;
  lyd_ctx *local_b0;
  anon_union_8_2_93990481_for_lyxml_ctx_9 *local_a8;
  ly_set *local_a0;
  lyxml_ctx pxmlctx;
  
  meta = (lyd_meta *)0x0;
  attr = (lyd_attr *)0x0;
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  insert_anchor = (lyd_node *)0x0;
  local_c8 = (lyd_node *)first_p;
  if (parent == (lyd_node *)0x0 && first_p == (lyd_node **)0x0) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3f2,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  plVar14 = lydctx->xmlctx;
  local_158 = plVar14->ctx;
  local_bc = lydctx->parse_opts;
  uVar24 = local_bc & 0xffbfffff;
  lydctx->parse_opts = uVar24;
  local_a0 = parsed;
  if (plVar14->status != LYXML_ELEMENT) {
    __assert_fail("xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3fc,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  pcVar21 = (plVar14->field_3).prefix;
  local_110 = (plVar14->field_4).prefix_len;
  str = (plVar14->field_5).name;
  str_len = (plVar14->field_6).name_len;
  LVar7 = lyxml_ctx_next(plVar14);
  sVar17 = local_110;
  plVar23 = local_158;
  if (LVar7 != LY_SUCCESS) goto LAB_00130e6f;
  local_148 = parent;
  local_138 = str;
  local_120 = pcVar21;
  local_118 = plVar14;
  if ((local_110 == 0 &&
       (((lydctx->int_opts & 0x80) != 0 && parent == (lyd_node *)0x0) && str_len != 0)) &&
     (iVar8 = ly_strncmp("eventTime",str,str_len), plVar23 = local_158, iVar8 == 0)) {
    if (local_118->status != LYXML_ELEM_CONTENT) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x40b,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if ((local_118->field_5).ws_only == '\0') {
      sVar17 = (local_118->field_4).prefix_len;
    }
    else {
      sVar17 = 0;
    }
    LVar7 = lyd_create_opaq(local_118->ctx,local_138,str_len,local_120,0,
                            "urn:ietf:params:xml:ns:netconf:notification:1.0",0x2f,
                            (local_118->field_3).prefix,sVar17,(ly_bool *)0x0,LY_VALUE_XML,
                            (void *)0x0,0x3f3,&node);
    if (LVar7 != LY_SUCCESS) goto LAB_00130e6f;
    LVar7 = lyd_parser_notif_eventtime_validate(node);
    plVar14 = local_118;
    if ((LVar7 == LY_SUCCESS) && (LVar7 = lyxml_ctx_next(local_118), LVar7 == LY_SUCCESS)) {
      local_13c = LY_SUCCESS;
      LVar9 = local_13c;
      if (plVar14->status != LYXML_ELEM_CLOSE) {
        ly_vlog(plVar23,(char *)0x0,LYVE_DATA,"Unexpected notification \"eventTime\" node children."
               );
        lyd_free_tree(node);
        LVar7 = LY_EVALID;
        goto LAB_00130e6f;
      }
      goto LAB_00131e5e;
    }
  }
  else {
    plVar14 = lydctx->xmlctx;
    plVar23 = plVar14->ctx;
    uVar2 = lydctx->int_opts;
    snode = (lysc_node *)0x0;
    ext = (lysc_ext_instance *)0x0;
    plVar10 = lyxml_ns_get(&plVar14->ns,local_120,sVar17);
    if (plVar10 == (lyxml_ns *)0x0) {
      if ((lydctx->int_opts & 0x10) == 0) {
        lydxml_log_namespace_err(plVar14,local_120,local_110,(char *)0x0,0);
      }
      else {
LAB_0013104e:
        LVar7 = LY_SUCCESS;
        if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_00131384;
        if (plVar10 == (lyxml_ns *)0x0) {
          if (local_110 == 0) {
            ly_vlog(plVar23,(char *)0x0,LYVE_REFERENCE,"No default namespace in the context.");
          }
          else {
            ly_vlog(plVar23,(char *)0x0,LYVE_REFERENCE,
                    "No module with namespace \"%.*s\" in the context.",local_110,local_120);
          }
        }
        else {
          ly_vlog(plVar23,(char *)0x0,LYVE_REFERENCE,
                  "No module with namespace \"%s\" in the context.",plVar10->uri);
        }
      }
LAB_0013137e:
      LVar7 = LY_EVALID;
    }
    else {
      ctx = plVar23;
      if (local_148 != (lyd_node *)0x0) {
        if (local_148->schema == (lysc_node *)0x0) {
          plVar11 = (lys_module *)&local_148[2].schema;
        }
        else {
          plVar11 = local_148->schema->module;
        }
        ctx = plVar11->ctx;
      }
      plVar11 = ly_ctx_get_module_implemented_ns(ctx,plVar10->uri);
      plVar18 = local_148;
      if (plVar11 == (lys_module *)0x0) {
        LVar7 = ly_nested_ext_schema
                          (local_148,(lysc_node *)0x0,local_120,local_110,LY_VALUE_XML,
                           &lydctx->xmlctx->ns,local_138,str_len,&snode,&ext);
        if (LVar7 == LY_ENOT) goto LAB_0013104e;
      }
      else {
        options = (uVar2 & 4) << 2;
        if ((local_148 == (lyd_node *)0x0) && (lydctx->ext != (lysc_ext_instance *)0x0)) {
          snode = lysc_ext_find_node(lydctx->ext,plVar11,local_138,str_len,0,options);
        }
        else {
          plVar12 = lyd_parser_node_schema(local_148);
          snode = lys_find_child(plVar12,plVar11,local_138,str_len,0,options);
        }
        if (snode == (lysc_node *)0x0) {
          plVar12 = (lysc_node *)&ext;
          LVar7 = ly_nested_ext_schema
                            (plVar18,(lysc_node *)0x0,local_120,local_110,LY_VALUE_XML,
                             &lydctx->xmlctx->ns,local_138,str_len,&snode,
                             (lysc_ext_instance **)plVar12);
          if ((LVar7 == LY_ENOT) && (LVar7 = LY_SUCCESS, (lydctx->parse_opts & 0x20000) != 0)) {
            if (local_148 == (lyd_node *)0x0) {
              plVar3 = lydctx->ext;
              if (plVar3 == (lysc_ext_instance *)0x0) {
                pcVar21 = "Node \"%.*s\" not found in the \"%s\" module.";
                plVar28 = (lysc_node *)plVar11->name;
              }
              else {
                plVar5 = (lysc_node *)plVar3->def->name;
                if ((lysc_node *)plVar3->argument == (lysc_node *)0x0) {
                  pcVar21 = "Node \"%.*s\" not found in the %s extension instance.";
                  plVar28 = plVar5;
                }
                else {
                  pcVar21 = "Node \"%.*s\" not found in the \"%s\" %s extension instance.";
                  plVar28 = (lysc_node *)plVar3->argument;
                  plVar12 = plVar5;
                }
              }
            }
            else {
              pplVar20 = (lysc_node **)&local_148->schema->name;
              if (local_148->schema == (lysc_node *)0x0) {
                pplVar20 = &local_148[1].schema;
              }
              pcVar21 = "Node \"%.*s\" not found as a child of \"%s\" node.";
              plVar28 = *pplVar20;
            }
            ly_vlog(plVar23,(char *)0x0,LYVE_REFERENCE,pcVar21,str_len & 0xffffffff,local_138,
                    plVar28,plVar12);
            goto LAB_0013137e;
          }
        }
        else {
          LVar7 = lyd_parser_check_schema((lyd_ctx *)lydctx,snode);
          if (LVar7 == LY_SUCCESS) {
            plVar14 = lydctx->xmlctx;
            hints = 0;
            LVar7 = LY_SUCCESS;
            if (((lydctx->parse_opts & 0x40000) != 0) && ((snode->nodetype & 0x71d) != 0)) {
              if ((plVar14->elements).count == 0) {
                __assert_fail("xmlctx->elements.count",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x19b,
                              "LY_ERR lydxml_data_check_opaq(struct lyd_xml_ctx *, const struct lysc_node **)"
                             );
              }
              LVar7 = lyxml_ctx_backup(plVar14,&pxmlctx);
              if (LVar7 == LY_SUCCESS) {
                while (plVar14->status == LYXML_ATTRIBUTE) {
                  LVar7 = lyxml_ctx_next(plVar14);
                  if ((LVar7 != LY_SUCCESS) ||
                     (LVar7 = lyxml_ctx_next(plVar14), LVar7 != LY_SUCCESS)) goto LAB_00131d1b;
                }
                if ((snode->nodetype & 0xc) == 0) {
                  if (snode->nodetype == 0x10) {
                    LVar7 = lyxml_ctx_next(plVar14);
                    if (LVar7 == LY_SUCCESS) {
                      LVar7 = lydxml_check_list(plVar14,snode);
                      if (LVar7 != LY_SUCCESS) {
                        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                               "Parsing opaque list node \"%s\" with missing/invalid keys.",
                               snode->name);
                        goto LAB_00131280;
                      }
                      LVar7 = LY_SUCCESS;
                    }
                  }
                  else {
                    if (plVar14->status != LYXML_ELEM_CONTENT) {
                      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                    ,0x1bb,
                                    "LY_ERR lydxml_data_check_opaq(struct lyd_xml_ctx *, const struct lysc_node **)"
                                   );
                    }
                    LVar7 = LY_SUCCESS;
                    if ((plVar14->field_5).ws_only == '\0') goto LAB_00131280;
                  }
                }
                else {
                  opts = ly_temp_log_options(&hints);
                  LVar7 = LY_SUCCESS;
                  LVar9 = ly_value_validate((ly_ctx *)0x0,snode,(plVar14->field_3).prefix,
                                            (plVar14->field_4).prefix_len,LY_VALUE_XML,&plVar14->ns,
                                            0x3f3);
                  ly_temp_log_options(opts);
                  if (LVar9 != LY_SUCCESS) {
                    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                           "Parsing opaque term node \"%s\" with invalid value \"%.*s\".",
                           snode->name,(ulong)*(uint *)&plVar14->field_4,(plVar14->field_3).prefix);
LAB_00131280:
                    LVar7 = LY_SUCCESS;
                    snode = (lysc_node *)0x0;
                  }
                }
LAB_00131d1b:
                lyxml_ctx_restore(plVar14,&pxmlctx);
              }
            }
          }
        }
      }
    }
LAB_00131384:
    plVar18 = local_148;
    plVar12 = snode;
    plVar23 = local_158;
    if (LVar7 != LY_SUCCESS) {
      if ((LVar7 == LY_EVALID) && (LVar7 = LY_EVALID, (lydctx->val_opts & 4) != 0)) {
        LVar9 = lydxml_data_skip(local_118);
        LVar7 = LY_EVALID;
        if (LVar9 != LY_SUCCESS) {
          LVar7 = LVar9;
        }
      }
      goto LAB_00130e6f;
    }
    if ((snode == (lysc_node *)0x0) && ((lydctx->parse_opts & 0x40000) == 0)) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Skipping parsing of unknown node \"%.*s\".",
             str_len & 0xffffffff,local_138);
      LVar7 = lydxml_data_skip(local_118);
      goto LAB_00130e6f;
    }
    local_f0 = snode;
    local_13c = LY_SUCCESS;
    LVar7 = LY_SUCCESS;
    if (local_118->status == LYXML_ATTRIBUTE) {
      if (snode == (lysc_node *)0x0) {
        if ((lydctx->parse_opts & 0x40000) == 0) {
          __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x43a,
                        "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                       );
        }
        LVar7 = lydxml_attrs(local_118,&attr);
      }
      else {
        local_128 = lydctx->xmlctx;
        meta = (lyd_meta *)0x0;
        LVar7 = LY_SUCCESS;
        local_b0 = (lyd_ctx *)lydctx;
        ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        iVar8 = strcmp(plVar12->module->name,"notifications");
        if (iVar8 != 0) {
          plVar3 = plVar12->exts;
          pvVar25 = (void *)0x0;
          plVar22 = plVar3;
          while( true ) {
            if (plVar3 == (lysc_ext_instance *)0x0) {
              pvVar13 = (void *)0x0;
            }
            else {
              pvVar13 = plVar3[-1].compiled;
            }
            bVar27 = pvVar13 <= pvVar25;
            if (bVar27) goto LAB_0013150d;
            plVar4 = plVar22->def;
            iVar8 = strcmp(plVar4->name,"get-filter-element-attributes");
            if ((iVar8 == 0) && (iVar8 = strcmp(plVar4->module->name,"ietf-netconf"), iVar8 == 0))
            break;
            pvVar25 = (void *)((long)pvVar25 + 1);
            plVar22 = plVar22 + 1;
          }
        }
        bVar27 = false;
LAB_0013150d:
        lydctx = (lyd_xml_ctx *)local_b0;
        plVar23 = local_158;
        if (local_128->status == LYXML_ATTRIBUTE) {
          local_e0 = (lysc_node *)&local_128->ns;
          local_a8 = &local_128->field_6;
          plVar14 = local_128;
          local_130 = str_len;
          do {
            str_len = local_130;
            if ((plVar14->field_4).prefix_len != 0) {
              plVar10 = lyxml_ns_get((ly_set *)local_e0,(plVar14->field_3).prefix,
                                     (plVar14->field_4).prefix_len);
              if (plVar10 == (lyxml_ns *)0x0) {
                lydxml_log_namespace_err
                          (plVar14,(plVar14->field_3).prefix,(plVar14->field_4).prefix_len,
                           (plVar14->field_5).name,(plVar14->field_6).name_len);
              }
              else {
                plVar11 = ly_ctx_get_module_implemented_ns(plVar14->ctx,plVar10->uri);
                plVar14 = local_128;
                if (plVar11 != (lys_module *)0x0) goto LAB_001316ab;
                if ((((lyd_ctx *)lydctx)->parse_opts & 0x20000) == 0) {
                  LVar7 = lyxml_ctx_next(local_128);
                  str_len = local_130;
                  if (LVar7 == LY_SUCCESS) {
                    if (plVar14->status != LYXML_ATTR_CONTENT) {
                      __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                    ,0xab,
                                    "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                                   );
                    }
                    goto LAB_0013167e;
                  }
                  goto LAB_0013189e;
                }
                pcVar21 = ":";
                if ((local_128->field_4).prefix_len == 0) {
                  pcVar21 = "";
                }
                ly_vlog(local_128->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Unknown (or not implemented) YANG module with namespace \"%s\" for metadata \"%.*s%s%.*s\"."
                        ,plVar10->uri,(local_128->field_4).prefix_len,(local_128->field_3).prefix,
                        pcVar21,(ulong)*(uint *)&local_128->field_6,(local_128->field_5).name);
              }
              LVar7 = LY_ENOTFOUND;
              str_len = local_130;
              goto LAB_0013189e;
            }
            if ((bVar27) ||
               ((iVar8 = ly_strncmp("type",(plVar14->field_5).name,(plVar14->field_6).name_len),
                iVar8 != 0 &&
                (iVar8 = ly_strncmp("select",(local_128->field_5).name,(local_128->field_6).name_len
                                   ), plVar14 = local_128, iVar8 != 0)))) {
              if ((((lyd_ctx *)lydctx)->parse_opts & 0x20000) != 0) {
                ly_vlog(plVar14->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Missing mandatory prefix for XML metadata \"%.*s\".",
                        (ulong)*(uint *)&plVar14->field_6,(plVar14->field_5).name);
                plVar15 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
                LVar7 = LY_EVALID;
                if (((((lyd_ctx *)lydctx)->val_opts & 4) != 0) &&
                   (LVar7 = LY_SUCCESS, plVar15->vecode == LYVE_SYNTAX)) {
                  LVar7 = LY_EVALID;
                }
                plVar14 = local_128;
                if (LVar7 != LY_SUCCESS) {
                  plVar18 = local_148;
                  if (LVar7 != LY_EVALID) goto LAB_001318cb;
                  goto LAB_0013189e;
                }
              }
              LVar7 = lyxml_ctx_next(plVar14);
              str_len = local_130;
              if (LVar7 != LY_SUCCESS) goto LAB_0013189e;
              if (plVar14->status != LYXML_ATTR_CONTENT) {
                __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x90,
                              "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                             );
              }
LAB_0013167e:
              LVar7 = lyxml_ctx_next(plVar14);
            }
            else {
              plVar11 = ly_ctx_get_module_implemented(local_128->ctx,"ietf-netconf");
              if (plVar11 == (lys_module *)0x0) {
                ly_vlog(local_128->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Missing (or not implemented) YANG module \"ietf-netconf\" for special filter attributes."
                       );
                LVar7 = LY_ENOTFOUND;
                goto LAB_0013189e;
              }
LAB_001316ab:
              plVar14 = local_128;
              pcVar21 = (local_128->field_5).name;
              sVar17 = (local_128->field_6).name_len;
              local_e8 = plVar11;
              LVar7 = lyxml_ctx_next(local_128);
              str_len = local_130;
              plVar23 = local_158;
              if (LVar7 != LY_SUCCESS) goto LAB_0013189e;
              if (plVar14->status != LYXML_ATTR_CONTENT) {
                __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0xb5,
                              "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                             );
              }
              LVar7 = lyd_parser_create_meta
                                ((lyd_ctx *)lydctx,(lyd_node *)0x0,&meta,local_e8,pcVar21,sVar17,
                                 (plVar14->field_3).prefix,(plVar14->field_4).prefix_len,
                                 &local_a8->dynamic,LY_VALUE_XML,local_e0,0x3f3,local_f0);
              str_len = local_130;
              plVar23 = local_158;
              if (LVar7 != LY_SUCCESS) goto LAB_0013189e;
              LVar7 = lyxml_ctx_next(plVar14);
              plVar23 = local_158;
            }
            str_len = local_130;
            if (LVar7 != LY_SUCCESS) goto LAB_0013189e;
          } while (plVar14->status == LYXML_ATTRIBUTE);
          LVar7 = LY_SUCCESS;
        }
LAB_0013189e:
        ly_log_location_revert(1,0,0,0);
        plVar18 = local_148;
        if (LVar7 != LY_SUCCESS) {
          lyd_free_meta_siblings(meta);
          meta = (lyd_meta *)0x0;
          plVar18 = local_148;
        }
      }
    }
LAB_001318cb:
    LVar9 = local_13c;
    if ((LVar7 != LY_SUCCESS) &&
       (((plVar15 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx), LVar7 != LY_EVALID ||
         ((((lyd_ctx *)lydctx)->val_opts & 4) == 0)) ||
        (local_13c = LY_EVALID, LVar9 = LVar7, plVar15->vecode == LYVE_SYNTAX)))) goto LAB_00130e6f;
    local_13c = LVar9;
    plVar12 = snode;
    if (local_118->status != LYXML_ELEM_CONTENT) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x440,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if (snode == (lysc_node *)0x0) {
      plVar16 = local_c8;
      if (plVar18 == (lyd_node *)0x0) {
LAB_001319d8:
        plVar12 = *(lysc_node **)plVar16;
      }
      else {
        if ((plVar18->schema == (lysc_node *)0x0) || ((plVar18->schema->nodetype & 0x711) != 0)) {
          plVar16 = plVar18 + 1;
          goto LAB_001319d8;
        }
        plVar12 = (lysc_node *)0x0;
      }
      plVar14 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
      pxmlctx.ctx = (ly_ctx *)0x0;
      if ((((lyd_ctx *)lydctx)->parse_opts & 0x40000) == 0) {
        __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x29f,
                      "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                     );
      }
      node = (lyd_node *)0x0;
      local_128 = (lyxml_ctx *)(plVar14->field_3).prefix;
      plVar11 = (lys_module *)(plVar14->field_4).prefix_len;
      local_f0 = (lysc_node *)
                 CONCAT44(local_f0._4_4_,
                          (int)CONCAT71((int7)((ulong)plVar12 >> 8),(plVar14->field_6).dynamic));
      if ((plVar14->field_6).dynamic != '\0') {
        (plVar14->field_6).dynamic = '\0';
      }
      local_130 = CONCAT71(local_130._1_7_,(plVar14->field_5).ws_only);
      local_e0 = plVar12;
      LVar7 = ly_store_prefix_data
                        (plVar14->ctx,local_128,(size_t)plVar11,LY_VALUE_XML,&plVar14->ns,&local_d4,
                         &pxmlctx.ctx);
      if (LVar7 == LY_SUCCESS) {
        local_110 = local_110 & 0xffffffff;
        local_e8 = plVar11;
        plVar10 = lyxml_ns_get(&plVar14->ns,local_120,local_110);
        if (plVar10 == (lyxml_ns *)0x0) {
          pcVar21 = (char *)0x0;
        }
        else {
          pcVar21 = plVar10->uri;
        }
        lydxml_get_hints_opaq
                  (local_138,str_len & 0xffffffff,(plVar14->field_3).prefix,
                   (plVar14->field_4).prefix_len,(lyd_node *)local_e0,pcVar21,&hints,&insert_anchor)
        ;
        plVar23 = plVar14->ctx;
        if (pcVar21 == (char *)0x0) {
          sVar17 = 0;
        }
        else {
          sVar17 = strlen(pcVar21);
        }
        cVar26 = (char)local_f0;
        LVar7 = lyd_create_opaq(plVar23,local_138,str_len & 0xffffffff,local_120,local_110,pcVar21,
                                sVar17,(char *)0x0,0,(ly_bool *)0x0,local_d4,(void *)0x0,hints,&node
                               );
        plVar23 = local_158;
        if (LVar7 == LY_SUCCESS) {
          if (node == (lyd_node *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                          ,700,
                          "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                         );
          }
          ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
          LVar7 = lyxml_ctx_next(plVar14);
          plVar18 = node;
          while (node = plVar18, LVar7 == LY_SUCCESS) {
            if (plVar14->status != LYXML_ELEMENT) {
              lVar6._0_4_ = plVar18[1].hash;
              lVar6._4_4_ = plVar18[1].flags;
              if (lVar6 == 0) {
                if (local_e8 != (lys_module *)0x0) {
                  lydict_remove(plVar14->ctx,(char *)plVar18[1].prev);
                  if (cVar26 == '\0') {
                    LVar7 = lydict_insert(plVar14->ctx,(char *)local_128,(size_t)local_e8,
                                          (char **)&plVar18[1].prev);
                    plVar23 = local_158;
                    if (LVar7 != LY_SUCCESS) {
                      cVar26 = '\0';
                      break;
                    }
                    cVar26 = '\0';
                  }
                  else {
                    LVar7 = lydict_insert_zc(plVar14->ctx,(char *)local_128,
                                             (char **)&plVar18[1].prev);
                    plVar23 = local_158;
                    if (LVar7 != LY_SUCCESS) {
                      cVar26 = '\x01';
                      break;
                    }
                    cVar26 = '\0';
                  }
                }
              }
              else if ((char)local_130 == '\0') {
                pplVar20 = &plVar18[1].schema;
                if (plVar18->schema != (lysc_node *)0x0) {
                  pplVar20 = (lysc_node **)&plVar18->schema->name;
                }
                LVar7 = LY_EVALID;
                ly_vlog(plVar14->ctx,(char *)0x0,LYVE_SYNTAX_XML,
                        "Mixed XML content node \"%s\" found, not supported.",*pplVar20);
                break;
              }
              if (plVar18[1].priv != (void *)0x0) {
                __assert_fail("!opaq->val_prefix_data",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x2dc,
                              "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                             );
              }
              plVar18[1].priv = pxmlctx.ctx;
              pxmlctx.ctx = (ly_ctx *)0x0;
              LVar7 = LY_SUCCESS;
              break;
            }
            first_p_00 = lyd_node_child_p(plVar18);
            LVar7 = lydxml_subtree_r(lydctx,plVar18,first_p_00,(ly_set *)0x0);
            plVar18 = node;
          }
        }
      }
      else {
        cVar26 = (char)local_f0;
        plVar23 = local_158;
      }
      if (node != (lyd_node *)0x0) {
        ly_log_location_revert(0,1,0,0);
      }
      ly_free_prefix_data(local_d4,pxmlctx.ctx);
      if (cVar26 != '\0') {
        free(local_128);
      }
      if (LVar7 != LY_SUCCESS) {
        lyd_free_tree(node);
        node = (lyd_node *)0x0;
      }
    }
    else {
      uVar1 = snode->nodetype;
      if ((uVar1 & 0xc) == 0) {
        if ((uVar1 & 0x711) == 0) {
          if ((uVar1 & 0x60) == 0) {
            __assert_fail("snode->nodetype & LYD_NODE_ANY",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                          ,0x44d,
                          "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                         );
          }
          LVar7 = lydxml_subtree_any(lydctx,snode,ext,&node);
        }
        else {
          LVar7 = lydxml_subtree_inner(lydctx,snode,ext,&node);
        }
      }
      else {
        plVar14 = (lyxml_ctx *)((lyd_ctx *)lydctx)->data_ctx;
        node = (lyd_node *)0x0;
        LVar9 = lyd_parser_create_term
                          ((lyd_ctx *)lydctx,snode,(plVar14->field_3).prefix,
                           (plVar14->field_4).prefix_len,&(plVar14->field_6).dynamic,LY_VALUE_XML,
                           &plVar14->ns,0x3f3,&node);
        if (LVar9 != LY_SUCCESS) {
          plVar15 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
          LVar7 = LVar9;
          if (((LVar9 == LY_EVALID) && ((((lyd_ctx *)lydctx)->val_opts & 4) != 0)) &&
             (plVar15->vecode != LYVE_SYNTAX)) goto LAB_00131aaa;
          goto LAB_00131dd7;
        }
        LVar9 = LY_SUCCESS;
LAB_00131aaa:
        if (node != (lyd_node *)0x0) {
          ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
        }
        if ((node == (lyd_node *)0x0 || local_148 == (lyd_node *)0x0) ||
           ((plVar12->flags & 0x100) == 0)) {
LAB_00131d7c:
          LVar7 = lyxml_ctx_next(plVar14);
          if ((LVar7 == LY_SUCCESS) && (LVar7 = LVar9, plVar14->status == LYXML_ELEMENT)) {
            ly_vlog(plVar14->ctx,(char *)0x0,LYVE_SYNTAX,
                    "Child element \"%.*s\" inside a terminal node \"%s\" found.",
                    (ulong)*(uint *)&plVar14->field_6,(plVar14->field_5).name,plVar12->name);
            ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
            LVar7 = LY_EVALID;
          }
        }
        else {
          if ((local_148->schema == (lysc_node *)0x0) ||
             ((local_148->schema->nodetype & 0x711) != 0)) {
            plVar18 = *(lyd_node **)(local_148 + 1);
          }
          else {
            plVar18 = (lyd_node *)0x0;
          }
          plVar18 = lyd_insert_get_next_anchor(plVar18,node);
          if (((plVar18 == (lyd_node *)0x0) || (plVar18->schema == (lysc_node *)0x0)) ||
             ((plVar18->schema->flags & 0x100) == 0)) goto LAB_00131d7c;
          if ((((lyd_ctx *)lydctx)->parse_opts & 0x20000) == 0) {
            ly_log(plVar14->ctx,LY_LLWRN,LY_SUCCESS,"Invalid position of the key \"%s\" in a list.")
            ;
            goto LAB_00131d7c;
          }
          ly_vlog(plVar14->ctx,(char *)0x0,LYVE_DATA,"Invalid position of the key \"%s\" in a list."
                  ,plVar12->name);
          plVar15 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx);
          LVar7 = LY_EVALID;
          if ((((lyd_ctx *)lydctx)->val_opts & 4) != 0) {
            LVar9 = LY_EVALID;
            LVar7 = LY_EVALID;
            if (plVar15->vecode != LYVE_SYNTAX) goto LAB_00131d7c;
          }
        }
LAB_00131dd7:
        if (node != (lyd_node *)0x0) {
          ly_log_location_revert(0,1,0,0);
        }
        plVar23 = local_158;
        if ((LVar7 != LY_SUCCESS) &&
           ((LVar7 != LY_EVALID || ((((lyd_ctx *)lydctx)->val_opts & 4) == 0)))) {
          lyd_free_tree(node);
          node = (lyd_node *)0x0;
          plVar23 = local_158;
        }
      }
    }
    LVar9 = local_13c;
    if ((LVar7 != LY_SUCCESS) &&
       (((plVar15 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx), LVar7 != LY_EVALID ||
         ((((lyd_ctx *)lydctx)->val_opts & 4) == 0)) ||
        (local_13c = LY_EVALID, LVar9 = LVar7, plVar15->vecode == LYVE_SYNTAX)))) goto LAB_00130e6f;
LAB_00131e5e:
    local_13c = LVar9;
    LVar9 = local_13c;
    if ((node != (lyd_node *)0x0) && (snode != (lysc_node *)0x0)) {
      LVar7 = lyd_parser_set_data_flags(node,&meta,(lyd_ctx *)lydctx,ext);
      if (LVar7 != LY_SUCCESS) goto LAB_00131ef9;
      LVar9 = local_13c;
      if ((((((lyd_ctx *)lydctx)->parse_opts & 0x10000) == 0) &&
          (LVar7 = lyd_validate_node_ext(node,&((lyd_ctx *)lydctx)->ext_node), LVar9 = local_13c,
          LVar7 != LY_SUCCESS)) &&
         ((plVar15 = ly_err_last(((lyd_ctx *)lydctx)->data_ctx->ctx), LVar7 != LY_EVALID ||
          (((((lyd_ctx *)lydctx)->val_opts & 4) == 0 ||
           (local_13c = LY_EVALID, LVar9 = LVar7, plVar15->vecode == LYVE_SYNTAX))))))
      goto LAB_00130e6f;
    }
    local_13c = LVar9;
    if (local_118->status != LYXML_ELEM_CLOSE) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x460,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if (((local_bc >> 0x16 & 1) != 0) || (LVar7 = lyxml_ctx_next(local_118), LVar7 == LY_SUCCESS)) {
      LVar7 = local_13c;
      if (node == (lyd_node *)0x0) goto LAB_00130e6f;
      if (snode == (lysc_node *)0x0) {
        lyd_insert_attr(node,attr);
        attr = (lyd_attr *)0x0;
      }
      else {
        lyd_insert_meta(node,meta,'\0');
        meta = (lyd_meta *)0x0;
      }
      plVar18 = local_c8;
      if (insert_anchor == (lyd_node *)0x0) {
        if (ext == (lysc_ext_instance *)0x0) {
          lyd_insert_node(local_148,(lyd_node **)local_c8,node,
                          ((lyd_ctx *)lydctx)->parse_opts >> 0x15 & 1);
        }
        else {
          LVar7 = lyplg_ext_insert(local_148,node);
          if (LVar7 != LY_SUCCESS) goto LAB_00131ef9;
        }
      }
      else {
        lyd_insert_after(insert_anchor,node);
      }
      if (local_148 == (lyd_node *)0x0) {
        lVar19._0_4_ = plVar18->hash;
        lVar19._4_4_ = plVar18->flags;
        while (lVar19 = *(long *)(lVar19 + 0x20), *(long *)(lVar19 + 0x18) != 0) {
          plVar18->hash = (int)lVar19;
          plVar18->flags = (int)((ulong)lVar19 >> 0x20);
        }
      }
      LVar7 = local_13c;
      if (local_a0 != (ly_set *)0x0) {
        ly_set_add(local_a0,node,'\x01',(uint32_t *)0x0);
        LVar7 = local_13c;
      }
      goto LAB_00130e6f;
    }
  }
LAB_00131ef9:
  lyd_free_tree(node);
LAB_00130e6f:
  ((lyd_ctx *)lydctx)->parse_opts = uVar24;
  lyd_free_meta_siblings(meta);
  lyd_free_attr_siblings(plVar23,attr);
  return LVar7;
}

Assistant:

static LY_ERR
lydxml_subtree_r(struct lyd_xml_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    const char *prefix, *name;
    size_t prefix_len, name_len;
    struct lyxml_ctx *xmlctx;
    const struct ly_ctx *ctx;
    struct lyd_meta *meta = NULL;
    struct lyd_attr *attr = NULL;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    uint32_t orig_parse_opts;
    struct lyd_node *node = NULL, *insert_anchor = NULL;
    ly_bool parse_subtree;

    assert(parent || first_p);

    xmlctx = lydctx->xmlctx;
    ctx = xmlctx->ctx;

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;
    orig_parse_opts = lydctx->parse_opts;

    assert(xmlctx->status == LYXML_ELEMENT);

    /* remember element prefix and name */
    prefix = xmlctx->prefix;
    prefix_len = xmlctx->prefix_len;
    name = xmlctx->name;
    name_len = xmlctx->name_len;

    /* parser next */
    rc = lyxml_ctx_next(xmlctx);
    LY_CHECK_GOTO(rc, cleanup);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime, create node */
        assert(xmlctx->status == LYXML_ELEM_CONTENT);
        rc = lyd_create_opaq(xmlctx->ctx, name, name_len, prefix, prefix_len,
                "urn:ietf:params:xml:ns:netconf:notification:1.0", 47, xmlctx->value,
                xmlctx->ws_only ? 0 : xmlctx->value_len, NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA, &node);
        LY_CHECK_GOTO(rc, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        /* parser next */
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
        if (xmlctx->status != LYXML_ELEM_CLOSE) {
            LOGVAL(ctx, LYVE_DATA, "Unexpected notification \"eventTime\" node children.");
            rc = LY_EVALID;
            lyd_free_tree(node);
            goto cleanup;
        }

        goto node_parsed;
    }

    /* get the schema node */
    r = lydxml_subtree_get_snode(lydctx, parent, prefix, prefix_len, name, name_len, &snode, &ext);
    if (r) {
        rc = r;
        if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            /* skip the invalid data */
            if ((r = lydxml_data_skip(xmlctx))) {
                rc = r;
            }
        }
        goto cleanup;
    } else if (!snode && !(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
        LOGVRB("Skipping parsing of unknown node \"%.*s\".", (int)name_len, name);

        /* skip element with children */
        rc = lydxml_data_skip(xmlctx);
        goto cleanup;
    }

    /* create metadata/attributes */
    if (xmlctx->status == LYXML_ATTRIBUTE) {
        if (snode) {
            r = lydxml_metadata(lydctx, snode, &meta);
        } else {
            assert(lydctx->parse_opts & LYD_PARSE_OPAQ);
            r = lydxml_attrs(xmlctx, &attr);
        }
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

    assert(xmlctx->status == LYXML_ELEM_CONTENT);
    if (!snode) {
        /* opaque */
        r = lydxml_subtree_opaq(lydctx, parent ? lyd_child(parent) : *first_p, prefix, prefix_len, name, name_len,
                &insert_anchor, &node);
    } else if (snode->nodetype & LYD_NODE_TERM) {
        /* term */
        r = lydxml_subtree_term(lydctx, parent, snode, &node);
    } else if (snode->nodetype & LYD_NODE_INNER) {
        /* inner */
        r = lydxml_subtree_inner(lydctx, snode, ext, &node);
    } else {
        /* any */
        assert(snode->nodetype & LYD_NODE_ANY);
        r = lydxml_subtree_any(lydctx, snode, ext, &node);
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

node_parsed:
    if (node && snode) {
        /* add/correct flags */
        r = lyd_parser_set_data_flags(node, &meta, (struct lyd_ctx *)lydctx, ext);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* store for ext instance node validation, if needed */
            r = lyd_validate_node_ext(node, &lydctx->ext_node);
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        }
    }

    /* parser next */
    assert(xmlctx->status == LYXML_ELEM_CLOSE);
    if (!parse_subtree) {
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    }

    LY_CHECK_GOTO(!node, cleanup);

    /* add metadata/attributes */
    if (snode) {
        lyd_insert_meta(node, meta, 0);
        meta = NULL;
    } else {
        lyd_insert_attr(node, attr);
        attr = NULL;
    }

    /* insert, keep first pointer correct */
    if (insert_anchor) {
        lyd_insert_after(insert_anchor, node);
    } else if (ext) {
        r = lyplg_ext_insert(parent, node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    } else {
        lyd_insert_node(parent, first_p, node,
                lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT);
    }
    while (!parent && (*first_p)->prev->next) {
        *first_p = (*first_p)->prev;
    }

    /* rememeber a successfully parsed node */
    if (parsed) {
        ly_set_add(parsed, node, 1, NULL);
    }

cleanup:
    lydctx->parse_opts = orig_parse_opts;
    lyd_free_meta_siblings(meta);
    lyd_free_attr_siblings(ctx, attr);
    return rc;
}